

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O1

lzma_ret delta_encoder_update
                   (void *coder_ptr,lzma_allocator *allocator,lzma_filter *filters_null,
                   lzma_filter *reversed_filters)

{
  lzma_ret lVar1;
  
  lVar1 = lzma_next_filter_update((lzma_next_coder *)coder_ptr,allocator,reversed_filters + 1);
  return lVar1;
}

Assistant:

static lzma_ret
delta_encoder_update(void *coder_ptr, const lzma_allocator *allocator,
		const lzma_filter *filters_null lzma_attribute((__unused__)),
		const lzma_filter *reversed_filters)
{
	lzma_delta_coder *coder = coder_ptr;

	// Delta doesn't and will never support changing the options in
	// the middle of encoding. If the app tries to change them, we
	// simply ignore them.
	return lzma_next_filter_update(
			&coder->next, allocator, reversed_filters + 1);
}